

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O0

int64_t try_restoration_unit
                  (RestSearchCtxt *rsc,RestorationTileLimits *limits,RestorationUnitInfo *rui)

{
  long lVar1;
  bool bVar2;
  uint plane_h;
  uint highbd_00;
  int64_t iVar3;
  long in_RDI;
  uint uVar4;
  int optimized_lr;
  YV12_BUFFER_CONFIG *fts;
  int highbd;
  int bit_depth;
  RestorationLineBuffers rlbs;
  RestorationInfo *rsi;
  int is_uv;
  int plane;
  AV1_COMMON *cm;
  int in_stack_ffffffffffffec9c;
  undefined4 in_stack_ffffffffffffeca4;
  undefined4 in_stack_ffffffffffffecac;
  int plane_w;
  undefined4 in_stack_ffffffffffffecb4;
  undefined1 local_12f9;
  undefined1 local_12d5;
  RestorationLineBuffers *in_stack_ffffffffffffed40;
  RestorationStripeBoundaries *in_stack_ffffffffffffed48;
  RestorationUnitInfo *in_stack_ffffffffffffed50;
  RestorationTileLimits *in_stack_ffffffffffffed58;
  int in_stack_ffffffffffffed80;
  int in_stack_ffffffffffffed88;
  int in_stack_ffffffffffffed90;
  int in_stack_ffffffffffffed98;
  uint8_t *in_stack_ffffffffffffeda0;
  int in_stack_ffffffffffffeda8;
  uint8_t *in_stack_ffffffffffffedb0;
  int in_stack_ffffffffffffedb8;
  int32_t *in_stack_ffffffffffffedc0;
  int in_stack_ffffffffffffedc8;
  aom_internal_error_info *in_stack_ffffffffffffedd0;
  
  lVar1 = *(long *)(in_RDI + 0x10);
  bVar2 = 0 < *(int *)(in_RDI + 0x20);
  plane_w = *(int *)(*(long *)(lVar1 + 0x6088) + 0x48);
  plane_h = (uint)*(byte *)(*(long *)(lVar1 + 0x6088) + 0x4c);
  local_12d5 = false;
  if (bVar2) {
    local_12d5 = *(int *)(*(long *)(lVar1 + 0x6088) + 0x60) != 0;
  }
  highbd_00 = (uint)local_12d5;
  local_12f9 = false;
  if (bVar2) {
    local_12f9 = *(int *)(*(long *)(lVar1 + 0x6088) + 100) != 0;
  }
  uVar4 = (uint)local_12f9;
  av1_loop_restoration_filter_unit
            (in_stack_ffffffffffffed58,in_stack_ffffffffffffed50,in_stack_ffffffffffffed48,
             in_stack_ffffffffffffed40,plane_w,plane_h,in_stack_ffffffffffffed80,
             in_stack_ffffffffffffed88,in_stack_ffffffffffffed90,in_stack_ffffffffffffed98,
             in_stack_ffffffffffffeda0,in_stack_ffffffffffffeda8,in_stack_ffffffffffffedb0,
             in_stack_ffffffffffffedb8,in_stack_ffffffffffffedc0,in_stack_ffffffffffffedc8,
             in_stack_ffffffffffffedd0);
  iVar3 = sse_restoration_unit
                    ((RestorationTileLimits *)CONCAT44(in_stack_ffffffffffffecb4,plane_w),
                     (YV12_BUFFER_CONFIG *)CONCAT44(in_stack_ffffffffffffecac,plane_h),
                     (YV12_BUFFER_CONFIG *)CONCAT44(in_stack_ffffffffffffeca4,uVar4),
                     in_stack_ffffffffffffec9c,highbd_00);
  return iVar3;
}

Assistant:

static int64_t try_restoration_unit(const RestSearchCtxt *rsc,
                                    const RestorationTileLimits *limits,
                                    const RestorationUnitInfo *rui) {
  const AV1_COMMON *const cm = rsc->cm;
  const int plane = rsc->plane;
  const int is_uv = plane > 0;
  const RestorationInfo *rsi = &cm->rst_info[plane];
  RestorationLineBuffers rlbs;
  const int bit_depth = cm->seq_params->bit_depth;
  const int highbd = cm->seq_params->use_highbitdepth;

  const YV12_BUFFER_CONFIG *fts = &cm->cur_frame->buf;
  // TODO(yunqing): For now, only use optimized LR filter in decoder. Can be
  // also used in encoder.
  const int optimized_lr = 0;

  av1_loop_restoration_filter_unit(
      limits, rui, &rsi->boundaries, &rlbs, rsc->plane_w, rsc->plane_h,
      is_uv && cm->seq_params->subsampling_x,
      is_uv && cm->seq_params->subsampling_y, highbd, bit_depth,
      fts->buffers[plane], fts->strides[is_uv], rsc->dst->buffers[plane],
      rsc->dst->strides[is_uv], cm->rst_tmpbuf, optimized_lr, cm->error);

  return sse_restoration_unit(limits, rsc->src, rsc->dst, plane, highbd);
}